

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arrays.h
# Opt level: O2

bool __thiscall glslang::TArraySizes::isInnerSpecialization(TArraySizes *this)

{
  TVector<glslang::TArraySize> *pTVar1;
  int iVar2;
  TIntermTyped *pTVar3;
  int i;
  int iVar4;
  
  iVar2 = 1;
  do {
    i = iVar2;
    pTVar1 = (this->sizes).sizes;
    if (pTVar1 == (TVector<glslang::TArraySize> *)0x0) {
      iVar4 = 0;
    }
    else {
      iVar4 = (int)((ulong)((long)(pTVar1->
                                  super_vector<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                                  ).
                                  super__Vector_base<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(pTVar1->
                                 super_vector<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                                 ).
                                 super__Vector_base<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                                 ._M_impl.super__Vector_impl_data._M_start) >> 4);
    }
    if (iVar4 <= i) break;
    pTVar3 = TSmallArrayVector::getDimNode(&this->sizes,i);
    iVar2 = i + 1;
  } while (pTVar3 == (TIntermTyped *)0x0);
  return i < iVar4;
}

Assistant:

bool isInnerSpecialization() const
    {
        for (int d = 1; d < sizes.size(); ++d) {
            if (sizes.getDimNode(d) != nullptr)
                return true;
        }

        return false;
    }